

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<int,google::protobuf::internal::ExtensionSet::Extension>::
     construct<std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
               (allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                *alloc,slot_type *slot,
               pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> *args)

{
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> *alloc_local
  ;
  
  map_slot_policy<int,_google::protobuf::internal::ExtensionSet::Extension>::emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
  ::
  construct<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
            (alloc,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)&slot->value,
             args);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }